

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O2

void __thiscall
spvtools::opt::IRContext::AddCalls
          (IRContext *this,Function *func,
          queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *todo)

{
  Instruction *this_00;
  Op OVar1;
  uint32_t uVar2;
  BasicBlock *pBVar3;
  uint32_t index;
  pointer puVar4;
  Instruction **ppIVar5;
  uint32_t local_3c;
  Function *local_38;
  
  local_38 = func;
  for (puVar4 = (func->blocks_).
                super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar4 != (local_38->blocks_).
                super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; puVar4 = puVar4 + 1) {
    pBVar3 = (puVar4->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    ppIVar5 = (Instruction **)
              ((long)&(pBVar3->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
    while (this_00 = *ppIVar5,
          this_00 != &(pBVar3->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_) {
      OVar1 = this_00->opcode_;
      if (OVar1 == OpFunctionCall) {
        local_3c = Instruction::GetSingleWordInOperand(this_00,0);
        std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&todo->c,&local_3c);
        OVar1 = this_00->opcode_;
      }
      if (OVar1 == OpCooperativeMatrixPerElementOpNV) {
        local_3c = Instruction::GetSingleWordInOperand(this_00,1);
        std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&todo->c,&local_3c);
        OVar1 = this_00->opcode_;
      }
      if (OVar1 == OpCooperativeMatrixReduceNV) {
        local_3c = Instruction::GetSingleWordInOperand(this_00,2);
        std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&todo->c,&local_3c);
        OVar1 = this_00->opcode_;
      }
      if (OVar1 == OpCooperativeMatrixLoadTensorNV) {
        uVar2 = Instruction::GetSingleWordInOperand(this_00,3);
        index = (((uVar2 >> 3 & 1) + (uint)((uVar2 >> 4 & 1) != 0)) - (uint)((uVar2 & 2) == 0)) + 5;
        uVar2 = Instruction::GetSingleWordInOperand(this_00,index);
        if ((uVar2 & 2) != 0) {
          local_3c = Instruction::GetSingleWordInOperand(this_00,(uVar2 & 1) + index + 1);
          std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (&todo->c,&local_3c);
        }
      }
      pBVar3 = (puVar4->_M_t).
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      ppIVar5 = &(this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    }
  }
  return;
}

Assistant:

void IRContext::AddCalls(const Function* func, std::queue<uint32_t>* todo) {
  for (auto bi = func->begin(); bi != func->end(); ++bi)
    for (auto ii = bi->begin(); ii != bi->end(); ++ii) {
      if (ii->opcode() == spv::Op::OpFunctionCall)
        todo->push(ii->GetSingleWordInOperand(0));
      if (ii->opcode() == spv::Op::OpCooperativeMatrixPerElementOpNV)
        todo->push(ii->GetSingleWordInOperand(1));
      if (ii->opcode() == spv::Op::OpCooperativeMatrixReduceNV)
        todo->push(ii->GetSingleWordInOperand(2));
      if (ii->opcode() == spv::Op::OpCooperativeMatrixLoadTensorNV) {
        const auto memory_operands_index = 3;
        auto mask = ii->GetSingleWordInOperand(memory_operands_index);

        uint32_t count = 1;
        if (mask & uint32_t(spv::MemoryAccessMask::Aligned)) ++count;
        if (mask & uint32_t(spv::MemoryAccessMask::MakePointerAvailableKHR))
          ++count;
        if (mask & uint32_t(spv::MemoryAccessMask::MakePointerVisibleKHR))
          ++count;

        const auto tensor_operands_index = memory_operands_index + count;
        mask = ii->GetSingleWordInOperand(tensor_operands_index);
        count = 1;
        if (mask & uint32_t(spv::TensorAddressingOperandsMask::TensorView))
          ++count;

        if (mask & uint32_t(spv::TensorAddressingOperandsMask::DecodeFunc)) {
          todo->push(ii->GetSingleWordInOperand(tensor_operands_index + count));
        }
      }
    }
}